

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O2

void t_generator::parse_options
               (string *options,string *language,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *parsed_options)

{
  long lVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  string key;
  string value;
  string option;
  string local_50 [32];
  
  lVar1 = std::__cxx11::string::find((char)options,0x3a);
  std::__cxx11::string::substr((ulong)&option,(ulong)options);
  std::__cxx11::string::operator=((string *)language,(string *)&option);
  std::__cxx11::string::~string((string *)&option);
  if (lVar1 != -1) {
    uVar3 = lVar1 + 1;
    while ((uVar3 != 0xffffffffffffffff && (uVar3 < options->_M_string_length))) {
      lVar1 = std::__cxx11::string::find((char)options,0x2c);
      std::__cxx11::string::substr((ulong)&option,(ulong)options);
      uVar3 = lVar1 + 1U;
      if (lVar1 + 1U == 0) {
        uVar3 = 0xffffffffffffffff;
      }
      lVar1 = std::__cxx11::string::find((char)&option,0x3d);
      key._M_dataplus._M_p = (pointer)&key.field_2;
      key._M_string_length = 0;
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value._M_string_length = 0;
      key.field_2._M_local_buf[0] = '\0';
      value.field_2._M_local_buf[0] = '\0';
      if (lVar1 == -1) {
        std::__cxx11::string::_M_assign((string *)&key);
        std::__cxx11::string::assign((char *)&value);
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&option);
        std::__cxx11::string::operator=((string *)&key,local_50);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::substr((ulong)local_50,(ulong)&option);
        std::__cxx11::string::operator=((string *)&value,local_50);
        std::__cxx11::string::~string(local_50);
      }
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](parsed_options,&key);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
      std::__cxx11::string::~string((string *)&option);
    }
  }
  return;
}

Assistant:

void t_generator::parse_options(const string& options,
                                string& language,
                                map<string, string>& parsed_options) {
  string::size_type colon = options.find(':');
  language = options.substr(0, colon);

  if (colon != string::npos) {
    string::size_type pos = colon + 1;
    while (pos != string::npos && pos < options.size()) {
      string::size_type next_pos = options.find(',', pos);
      string option = options.substr(pos, next_pos - pos);
      pos = ((next_pos == string::npos) ? next_pos : next_pos + 1);

      string::size_type separator = option.find('=');
      string key, value;
      if (separator == string::npos) {
        key = option;
        value = "";
      } else {
        key = option.substr(0, separator);
        value = option.substr(separator + 1);
      }

      parsed_options[key] = value;
    }
  }
}